

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_512_paramSetB.c
# Opt level: O2

int point_mul_two_id_tc26_gost_3410_2012_512_paramSetB
              (EC_GROUP *group,EC_POINT *r,BIGNUM *n,EC_POINT *q,BIGNUM *m,BN_CTX *ctx)

{
  uint64_t *puVar1;
  uint64_t *output;
  uint64_t *out1;
  byte bVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  BIGNUM *pBVar8;
  BIGNUM *pBVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  byte bVar13;
  uint uVar14;
  pt_prj_t_conflict3 Q;
  uchar b_y [64];
  uchar b_x [64];
  uchar b_m [64];
  uchar b_n [64];
  pt_aff_t_conflict3 local_10d8;
  int8_t bnaf [513];
  int8_t anaf [513];
  pt_prj_t_conflict3 local_c38 [16];
  
  BN_CTX_start((BN_CTX *)ctx);
  pBVar8 = BN_CTX_get((BN_CTX *)ctx);
  pBVar9 = BN_CTX_get((BN_CTX *)ctx);
  iVar6 = 0;
  iVar7 = 0;
  if (((((pBVar9 != (BIGNUM *)0x0) &&
        (iVar5 = EC_POINT_get_affine_coordinates(group,q,pBVar8,pBVar9,ctx), iVar5 != 0)) &&
       (iVar5 = BN_bn2lebinpad(pBVar8,b_x,0x40), iVar7 = iVar6, iVar5 == 0x40)) &&
      ((iVar6 = BN_bn2lebinpad(pBVar9,b_y,0x40), iVar6 == 0x40 &&
       (iVar6 = BN_bn2lebinpad(n,b_n,0x40), iVar6 == 0x40)))) &&
     (iVar6 = BN_bn2lebinpad(m,b_m,0x40), iVar6 == 0x40)) {
    fiat_id_tc26_gost_3410_2012_512_paramSetB_from_bytes(local_10d8.X,b_x);
    puVar1 = local_10d8.Y;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_from_bytes(puVar1,b_y);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_to_montgomery(local_10d8.X,local_10d8.X);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_to_montgomery(puVar1,puVar1);
    memset(anaf,0,0x201);
    memset(bnaf,0,0x201);
    memset(&Q,0,0xc0);
    precomp_wnaf(local_c38,&local_10d8);
    scalar_wnaf(anaf,b_n);
    scalar_wnaf(bnaf,b_m);
    bVar13 = 0;
    bVar4 = true;
    for (uVar14 = 0x200; -1 < (int)uVar14; uVar14 = uVar14 - 1) {
      if (!bVar4) {
        point_double(&Q,&Q);
      }
      bVar2 = bnaf[uVar14];
      if (bVar2 != 0) {
        if (bVar13 != bVar2 >> 7) {
          fiat_id_tc26_gost_3410_2012_512_paramSetB_opp(Q.Y,Q.Y);
          bVar13 = bVar13 ^ 1;
        }
        uVar12 = (int)((int)(char)bVar2 - 1U) >> 1;
        if ((char)bVar2 < '\0') {
          uVar12 = (uint)~(int)(char)bVar2 >> 1;
        }
        if (bVar4) {
          Q.X[0] = local_c38[(int)uVar12].X[0];
          Q.X[1] = local_c38[(int)uVar12].X[1];
          Q.X[2] = local_c38[(int)uVar12].X[2];
          Q.X[3] = local_c38[(int)uVar12].X[3];
          Q.X[4] = local_c38[(int)uVar12].X[4];
          Q.X[5] = local_c38[(int)uVar12].X[5];
          Q.X[6] = local_c38[(int)uVar12].X[6];
          Q.X[7] = local_c38[(int)uVar12].X[7];
          Q.Y[0] = local_c38[(int)uVar12].Y[0];
          Q.Y[1] = local_c38[(int)uVar12].Y[1];
          Q.Y[2] = local_c38[(int)uVar12].Y[2];
          Q.Y[3] = local_c38[(int)uVar12].Y[3];
          Q.Y[4] = local_c38[(int)uVar12].Y[4];
          Q.Y[5] = local_c38[(int)uVar12].Y[5];
          Q.Y[6] = local_c38[(int)uVar12].Y[6];
          Q.Y[7] = local_c38[(int)uVar12].Y[7];
          Q.Z[2] = local_c38[(int)uVar12].Z[2];
          Q.Z[3] = local_c38[(int)uVar12].Z[3];
          Q.Z[4] = local_c38[(int)uVar12].Z[4];
          Q.Z[5] = local_c38[(int)uVar12].Z[5];
          Q.Z[6] = local_c38[(int)uVar12].Z[6];
          Q.Z[7] = local_c38[(int)uVar12].Z[7];
          Q.Z[0] = CONCAT44(*(undefined4 *)((long)local_c38[(int)uVar12].Z + 4),
                            (int)local_c38[(int)uVar12].Z[0]);
          Q.Z[1] = CONCAT44(*(undefined4 *)((long)local_c38[(int)uVar12].Z + 0xc),
                            (int)local_c38[(int)uVar12].Z[1]);
        }
        else {
          point_add_proj(&Q,&Q,local_c38 + (int)uVar12);
        }
        bVar4 = false;
      }
      cVar3 = anaf[uVar14];
      uVar12 = (uint)cVar3;
      if (uVar12 != 0) {
        if (bVar13 != ((byte)(uVar12 >> 7) & 1)) {
          fiat_id_tc26_gost_3410_2012_512_paramSetB_opp(Q.Y,Q.Y);
          bVar13 = bVar13 ^ 1;
        }
        uVar11 = (int)(uVar12 - 1) >> 1;
        if (cVar3 < '\0') {
          uVar11 = ~uVar12 >> 1;
        }
        if (bVar4) {
          Q.X[0] = lut_cmb[0][(int)uVar11].X[0];
          Q.X[1] = lut_cmb[0][(int)uVar11].X[1];
          Q.X[2] = lut_cmb[0][(int)uVar11].X[2];
          Q.X[3] = lut_cmb[0][(int)uVar11].X[3];
          Q.X[4] = lut_cmb[0][(int)uVar11].X[4];
          Q.X[5] = lut_cmb[0][(int)uVar11].X[5];
          Q.X[6] = lut_cmb[0][(int)uVar11].X[6];
          Q.X[7] = lut_cmb[0][(int)uVar11].X[7];
          Q.Y[0] = lut_cmb[0][(int)uVar11].Y[0];
          Q.Y[1] = lut_cmb[0][(int)uVar11].Y[1];
          Q.Y[2] = lut_cmb[0][(int)uVar11].Y[2];
          Q.Y[3] = lut_cmb[0][(int)uVar11].Y[3];
          Q.Y[4] = lut_cmb[0][(int)uVar11].Y[4];
          Q.Y[5] = lut_cmb[0][(int)uVar11].Y[5];
          Q.Y[6] = lut_cmb[0][(int)uVar11].Y[6];
          Q.Y[7] = lut_cmb[0][(int)uVar11].Y[7];
          Q.Z[0] = 0xffffffffffffff91;
          Q.Z[1] = 0xffffffffffffffff;
          Q.Z[2] = 0xffffffffffffffff;
          Q.Z[3] = 0xffffffffffffffff;
          Q.Z[4] = 0xffffffffffffffff;
          Q.Z[5] = 0xffffffffffffffff;
          Q.Z[6] = 0xffffffffffffffff;
          Q.Z[7] = 0x7fffffffffffffff;
        }
        else {
          point_add_mixed(&Q,&Q,lut_cmb[0] + (int)uVar11);
        }
        bVar4 = false;
      }
    }
    puVar1 = Q.Y;
    if (bVar4) {
      Q.X[6] = 0;
      Q.X[7] = 0;
      Q.X[4] = 0;
      Q.X[5] = 0;
      Q.X[2] = 0;
      Q.X[3] = 0;
      Q.X[0] = 0;
      Q.X[1] = 0;
      Q.Y[6] = 0xffffffffffffffff;
      Q.Y[7] = 0x7fffffffffffffff;
      Q.Y[4] = 0xffffffffffffffff;
      Q.Y[5] = 0xffffffffffffffff;
      Q.Y[2] = 0xffffffffffffffff;
      Q.Y[3] = 0xffffffffffffffff;
      Q.Y[0] = 0xffffffffffffff91;
      Q.Y[1] = 0xffffffffffffffff;
      Q.Z[0] = 0;
      Q.Z[1] = 0;
      Q.Z[2] = 0;
      Q.Z[3] = 0;
      Q.Z[4] = 0;
      Q.Z[5] = 0;
      Q.Z[6] = 0;
      Q.Z[7] = 0;
    }
    if (bVar13 != 0) {
      fiat_id_tc26_gost_3410_2012_512_paramSetB_opp(puVar1,puVar1);
    }
    output = Q.Z;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_inv(output,output);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mul(local_10d8.X,Q.X,output);
    out1 = local_10d8.Y;
    fiat_id_tc26_gost_3410_2012_512_paramSetB_mul(out1,puVar1,output);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_from_montgomery(local_10d8.X,local_10d8.X);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_from_montgomery(out1,out1);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_to_bytes(b_x,local_10d8.X);
    fiat_id_tc26_gost_3410_2012_512_paramSetB_to_bytes(b_y,out1);
    iVar7 = CRYPTO_memcmp("",b_x,0x40);
    if ((iVar7 == 0) && (iVar7 = CRYPTO_memcmp("",b_y,0x40), iVar7 == 0)) {
      iVar7 = EC_POINT_set_to_infinity((EC_GROUP *)group,(EC_POINT *)r);
      if (iVar7 == 0) {
        iVar7 = 0;
        goto LAB_00135552;
      }
    }
    else {
      lVar10 = BN_lebin2bn(b_x,0x40,pBVar8);
      iVar7 = 0;
      if ((lVar10 == 0) ||
         ((lVar10 = BN_lebin2bn(b_y,0x40,pBVar9), lVar10 == 0 ||
          (iVar6 = EC_POINT_set_affine_coordinates(group,r,pBVar8,pBVar9,ctx), iVar6 == 0))))
      goto LAB_00135552;
    }
    iVar7 = 1;
  }
LAB_00135552:
  BN_CTX_end((BN_CTX *)ctx);
  return iVar7;
}

Assistant:

int
    point_mul_two_id_tc26_gost_3410_2012_512_paramSetB(
        const EC_GROUP *group, EC_POINT *r, const BIGNUM *n, const EC_POINT *q,
        const BIGNUM *m, BN_CTX *ctx) {
    int ret = 0;
    unsigned char b_x[64];
    unsigned char b_y[64];
    unsigned char b_n[64];
    unsigned char b_m[64];
    BIGNUM *x = NULL, *y = NULL;

    BN_CTX_start(ctx);
    x = BN_CTX_get(ctx);
    if ((y = BN_CTX_get(ctx)) == NULL
        /* pull out coords as bytes */
        || !EC_POINT_get_affine_coordinates(group, q, x, y, ctx) ||
        BN_bn2lebinpad(x, b_x, 64) != 64 || BN_bn2lebinpad(y, b_y, 64) != 64 ||
        BN_bn2lebinpad(n, b_n, 64) != 64 || BN_bn2lebinpad(m, b_m, 64) != 64)
        goto err;
    /* do the simultaneous scalar multiplication */
    point_mul_two(b_x, b_y, b_n, b_m, b_x, b_y);
    /* check for infinity */
    if (CRYPTO_memcmp(const_zb, b_x, 64) == 0 &&
        CRYPTO_memcmp(const_zb, b_y, 64) == 0) {
        if (!EC_POINT_set_to_infinity(group, r)) goto err;
    } else {
        /* otherwise, pack the bytes into the result */
        if (BN_lebin2bn(b_x, 64, x) == NULL ||
            BN_lebin2bn(b_y, 64, y) == NULL ||
            !EC_POINT_set_affine_coordinates(group, r, x, y, ctx))
            goto err;
    }
    ret = 1;
err:
    BN_CTX_end(ctx);
    return ret;
}